

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::insert_move(Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
              *this,Node *keyval)

{
  undefined8 *puVar1;
  InfoType IVar2;
  Node *pNVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  InfoType IVar7;
  size_t insertion_idx;
  bool bVar8;
  long lVar9;
  long lVar10;
  InfoType info;
  size_t idx;
  InfoType local_3c;
  size_t local_38;
  
  if (this->mMaxNumElementsAllowed == 0) {
    bVar8 = try_increase_info(this);
    if (!bVar8) {
      throwOverflowError(this);
    }
  }
  local_38 = 0;
  local_3c = 0;
  Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>
  ::keyToIdx<Rml::Character&>
            ((Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>
              *)this,(Character *)keyval,&local_38,&local_3c);
  IVar2 = this->mInfoInc;
  lVar10 = local_38 * 0x28;
  for (; insertion_idx = local_38, IVar7 = local_3c, local_3c <= this->mInfo[local_38];
      local_3c = local_3c + IVar2) {
    local_38 = local_38 + 1;
    lVar10 = lVar10 + 0x28;
  }
  if (0xff < (local_3c & 0xff) + IVar2) {
    this->mMaxNumElementsAllowed = 0;
  }
  lVar9 = 0;
  for (; this->mInfo[local_38] != '\0'; local_38 = local_38 + 1) {
    lVar9 = lVar9 + -1;
    local_3c = IVar2 + local_3c;
  }
  pNVar3 = this->mKeyVals;
  if (lVar9 != 0) {
    shiftUp(this,local_38,insertion_idx);
  }
  *(undefined8 *)((long)&(pNVar3->mData).second.texcoords[1].y + lVar10) =
       *(undefined8 *)&(keyval->mData).second.texcoords[1].y;
  uVar4 = *(undefined8 *)&keyval->mData;
  uVar5 = *(undefined8 *)&(keyval->mData).second.origin.y;
  uVar6 = *(undefined8 *)&(keyval->mData).second.texcoords[0].y;
  puVar1 = (undefined8 *)((long)(pNVar3->mData).second.texcoords + lVar10 + -4);
  *puVar1 = *(undefined8 *)&(keyval->mData).second.dimensions.y;
  puVar1[1] = uVar6;
  puVar1 = (undefined8 *)((long)(pNVar3->mData).second.texcoords + lVar10 + -0x14);
  *puVar1 = uVar4;
  puVar1[1] = uVar5;
  this->mInfo[insertion_idx] = (uint8_t)IVar7;
  this->mNumElements = this->mNumElements + 1;
  return insertion_idx;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }